

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O1

void gen_lsa(DisasContext_conflict6 *ctx,int opc,int rd,int rs,int rt,int imm2)

{
  TCGContext_conflict6 *s;
  TCGTemp *a1;
  TCGTemp *a1_00;
  TCGv_i64 pTVar1;
  uintptr_t o_2;
  TCGOpcode TVar2;
  uintptr_t o_3;
  TCGv_i64 ret;
  
  if (rd == 0) {
    return;
  }
  s = ctx->uc->tcg_ctx;
  a1 = tcg_temp_new_internal_mips64el(s,TCG_TYPE_I64,false);
  ret = (TCGv_i64)((long)a1 - (long)s);
  a1_00 = tcg_temp_new_internal_mips64el(s,TCG_TYPE_I64,false);
  if (rs == 0) {
    TVar2 = INDEX_op_movi_i64;
    pTVar1 = (TCGv_i64)0x0;
LAB_0099b783:
    tcg_gen_op2_mips64el(s,TVar2,(TCGArg)a1,(TCGArg)pTVar1);
  }
  else if (s->cpu_gpr[rs] != ret) {
    pTVar1 = s->cpu_gpr[rs] + (long)s;
    TVar2 = INDEX_op_mov_i64;
    goto LAB_0099b783;
  }
  if (rt == 0) {
    TVar2 = INDEX_op_movi_i64;
    pTVar1 = (TCGv_i64)0x0;
  }
  else {
    if (s->cpu_gpr[rt] == (TCGv_i64)((long)a1_00 - (long)s)) goto LAB_0099b7ca;
    pTVar1 = (TCGv_i64)((long)&s->pool_cur + (long)s->cpu_gpr[rt]);
    TVar2 = INDEX_op_mov_i64;
  }
  tcg_gen_op2_mips64el(s,TVar2,(TCGArg)a1_00,(TCGArg)pTVar1);
LAB_0099b7ca:
  tcg_gen_shli_i64_mips64el(s,ret,ret,(ulong)(imm2 + 1));
  tcg_gen_op3_mips64el
            (s,INDEX_op_add_i64,(TCGArg)((long)&s->pool_cur + (long)s->cpu_gpr[(uint)rd]),(TCGArg)a1
             ,(TCGArg)a1_00);
  if (opc == 5) {
    tcg_gen_ext32s_i64_mips64el(s,s->cpu_gpr[(uint)rd],s->cpu_gpr[(uint)rd]);
  }
  tcg_temp_free_internal_mips64el(s,(TCGTemp *)((TCGv_i64)((long)a1_00 - (long)s) + (long)s));
  tcg_temp_free_internal_mips64el(s,(TCGTemp *)(ret + (long)s));
  return;
}

Assistant:

static void gen_lsa(DisasContext *ctx, int opc, int rd, int rs, int rt,
                    int imm2)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    TCGv t0;
    TCGv t1;
    if (rd == 0) {
        /* Treat as NOP. */
        return;
    }
    t0 = tcg_temp_new(tcg_ctx);
    t1 = tcg_temp_new(tcg_ctx);
    gen_load_gpr(tcg_ctx, t0, rs);
    gen_load_gpr(tcg_ctx, t1, rt);
    tcg_gen_shli_tl(tcg_ctx, t0, t0, imm2 + 1);
    tcg_gen_add_tl(tcg_ctx, tcg_ctx->cpu_gpr[rd], t0, t1);
    if (opc == OPC_LSA) {
        tcg_gen_ext32s_tl(tcg_ctx, tcg_ctx->cpu_gpr[rd], tcg_ctx->cpu_gpr[rd]);
    }

    tcg_temp_free(tcg_ctx, t1);
    tcg_temp_free(tcg_ctx, t0);

    return;
}